

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
common::
make_map<int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>_>
::make_map(make_map<int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>_>
           *this,int *key,
          map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>
          *val)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<lexer::Condition,_std::pair<const_lexer::Condition,_lexer::Transition>,_std::_Select1st<std::pair<const_lexer::Condition,_lexer::Transition>_>,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>
  *this_00;
  
  p_Var1 = &(this->map)._M_t._M_impl.super__Rb_tree_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &std::
             map<int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<lexer::Condition,_lexer::Transition,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>_>_>_>
             ::operator[](&this->map,key)->_M_t;
  std::
  _Rb_tree<lexer::Condition,_std::pair<const_lexer::Condition,_lexer::Transition>,_std::_Select1st<std::pair<const_lexer::Condition,_lexer::Transition>_>,_std::less<lexer::Condition>,_std::allocator<std::pair<const_lexer::Condition,_lexer::Transition>_>_>
  ::operator=(this_00,&val->_M_t);
  return;
}

Assistant:

make_map(K const& key, V const& val) {
            map[key] = val;
        }